

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O2

void __thiscall features::Surf::process(Surf *this)

{
  pointer pKVar1;
  pointer pDVar2;
  byte bVar3;
  ostream *poVar4;
  duration local_30;
  duration local_28;
  
  pKVar1 = (this->keypoints).
           super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->keypoints).
      super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
      _M_impl.super__Vector_impl_data._M_finish != pKVar1) {
    (this->keypoints).
    super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>._M_impl.
    super__Vector_impl_data._M_finish = pKVar1;
  }
  pDVar2 = (this->descriptors).
           super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->descriptors).
      super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_finish != pDVar2) {
    (this->descriptors).
    super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
    _M_impl.super__Vector_impl_data._M_finish = pDVar2;
  }
  std::vector<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>::clear
            (&this->octaves);
  std::chrono::_V2::system_clock::now();
  local_30.__r = std::chrono::_V2::system_clock::now();
  if ((this->options).verbose_output == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"SURF: Creating 4 octaves (0 to 4)...");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  local_28.__r = std::chrono::_V2::system_clock::now();
  create_octaves(this);
  bVar3 = (this->options).debug_output;
  if ((bool)bVar3 == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"SURF: Creating octaves took ");
    util::WallTimer::get_elapsed((WallTimer *)&local_28);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ms.");
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar3 = (this->options).debug_output;
  }
  if ((bVar3 & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"SURF: Detecting local extrema...");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  local_28.__r = std::chrono::_V2::system_clock::now();
  extrema_detection(this);
  bVar3 = (this->options).debug_output;
  if ((bool)bVar3 == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"SURF: Extrema detection took ");
    util::WallTimer::get_elapsed((WallTimer *)&local_28);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ms.");
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar3 = (this->options).debug_output;
  }
  if ((bVar3 & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"SURF: Localizing and filtering keypoints...");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  local_28.__r = std::chrono::_V2::system_clock::now();
  keypoint_localization_and_filtering(this);
  std::vector<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>::clear
            (&this->octaves);
  if ((this->options).debug_output == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"SURF: Localization and filtering took ");
    util::WallTimer::get_elapsed((WallTimer *)&local_28);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ms.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  if ((this->options).verbose_output == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"SURF: Generating keypoint descriptors...");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  local_28.__r = std::chrono::_V2::system_clock::now();
  descriptor_assignment(this);
  if ((this->options).debug_output == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"SURF: Generated ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," descriptors, took ");
    util::WallTimer::get_elapsed((WallTimer *)&local_28);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"ms.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  if ((this->options).verbose_output == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"SURF: Generated ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," descriptors from ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," keypoints,");
    poVar4 = std::operator<<(poVar4," took ");
    util::WallTimer::get_elapsed((WallTimer *)&local_30);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"ms.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void
Surf::process (void)
{
    this->keypoints.clear();
    this->descriptors.clear();
    this->octaves.clear();

    util::WallTimer timer, total_timer;

    /* Compute Hessian response maps and find SS maxima (SURF 3.3). */
    if (this->options.verbose_output)
    {
        std::cout << "SURF: Creating 4 octaves (0 to 4)..." << std::endl;
    }
    timer.reset();
    this->create_octaves();
    if (this->options.debug_output)
    {
        std::cout << "SURF: Creating octaves took "
            << timer.get_elapsed() << " ms." << std::endl;
    }

    /* Detect local extrema in the SS of Hessian response maps. */
    if (this->options.debug_output)
    {
        std::cout << "SURF: Detecting local extrema..." << std::endl;
    }
    timer.reset();
    this->extrema_detection();
    if (this->options.debug_output)
    {
        std::cout << "SURF: Extrema detection took "
            << timer.get_elapsed() << " ms." << std::endl;
    }

    /* Sub-pixel keypoint localization and filtering of weak keypoints. */
    if (this->options.debug_output)
    {
        std::cout << "SURF: Localizing and filtering keypoints..." << std::endl;
    }
    timer.reset();
    this->keypoint_localization_and_filtering();
    this->octaves.clear();
    if (this->options.debug_output)
    {
        std::cout << "SURF: Localization and filtering took "
            << timer.get_elapsed() << " ms." << std::endl;
    }

    /* Compute the SURF descriptor for the keypoint location. */
    if (this->options.verbose_output)
    {
        std::cout << "SURF: Generating keypoint descriptors..." << std::endl;
    }
    timer.reset();
    this->descriptor_assignment();
    if (this->options.debug_output)
    {
        std::cout << "SURF: Generated " << this->descriptors.size()
            << " descriptors, took " << timer.get_elapsed() << "ms."
            << std::endl;
    }
    if (this->options.verbose_output)
    {
        std::cout << "SURF: Generated " << this->descriptors.size()
            << " descriptors from " << this->keypoints.size() << " keypoints,"
            << " took " << total_timer.get_elapsed() << "ms." << std::endl;
    }

    /* Cleanup. */
    this->sat.reset();
}